

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  uint uVar2;
  global_State *pgVar3;
  int iVar4;
  TString *pTVar5;
  size_t sVar6;
  uint h;
  TString **ppTVar7;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    h = pgVar3->seed ^ (uint)l;
    if (l != 0) {
      sVar6 = l;
      do {
        h = h ^ (uint)(byte)str[sVar6 - 1] + (h >> 2) + h * 0x20;
        sVar6 = sVar6 + ~(l >> 5);
      } while (l >> 5 < sVar6);
    }
    uVar2 = (pgVar3->strt).size;
    if ((uVar2 - 1 & uVar2) != 0) {
      __assert_fail("(g->strt.size&(g->strt.size-1))==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0xab,"TString *internshrstr(lua_State *, const char *, size_t)");
    }
    if (str == (char *)0x0) {
      __assert_fail("str != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,0xac,"TString *internshrstr(lua_State *, const char *, size_t)");
    }
    ppTVar7 = (pgVar3->strt).hash + (int)(uVar2 - 1 & h);
    for (pTVar5 = *ppTVar7; pTVar5 != (TString *)0x0; pTVar5 = (pTVar5->u).hnext) {
      if ((pTVar5->shrlen == l) && (iVar4 = bcmp(str,pTVar5 + 1,l), iVar4 == 0)) {
        if (((pgVar3->currentwhite ^ 0x18) & pTVar5->marked) == 0) {
          return pTVar5;
        }
        pTVar5->marked = pTVar5->marked ^ 0x18;
        return pTVar5;
      }
    }
    if (((int)uVar2 < 0x40000000) && ((int)uVar2 <= (pgVar3->strt).nuse)) {
      luaS_resize(L,uVar2 * 2);
      uVar2 = (pgVar3->strt).size;
      if ((uVar2 - 1 & uVar2) != 0) {
        __assert_fail("(g->strt.size&(g->strt.size-1))==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                      ,0xb8,"TString *internshrstr(lua_State *, const char *, size_t)");
      }
      ppTVar7 = (pgVar3->strt).hash + (int)(uVar2 - 1 & h);
    }
    pTVar5 = createstrobj(L,l,4,h);
    memcpy(pTVar5 + 1,str,l);
    pTVar5->shrlen = (lu_byte)l;
    (pTVar5->u).hnext = *ppTVar7;
    *ppTVar7 = pTVar5;
    piVar1 = &(pgVar3->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffe6 < l) {
      luaM_toobig(L);
    }
    pTVar5 = createstrobj(L,l,0x14,L->l_G->seed);
    (pTVar5->u).lnglen = l;
    memcpy(pTVar5 + 1,str,l);
  }
  return pTVar5;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l >= (MAX_SIZE - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}